

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

int addUpvalue(Compiler *compiler,uint8_t index,_Bool isLocal)

{
  uint uVar1;
  ObjFunction *pOVar2;
  long lVar3;
  ulong uVar4;
  
  pOVar2 = compiler->function;
  uVar1 = pOVar2->upvalueCount;
  lVar3 = (long)(int)uVar1;
  if (0 < lVar3) {
    uVar4 = 0;
    do {
      if ((compiler->upvalues[uVar4].index == index) &&
         (compiler->upvalues[uVar4].isLocal == isLocal)) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
    if (uVar1 == 0x100) {
      errorAt(&parser.previous,"Too many closure variables in function.");
      return 0;
    }
  }
  compiler->upvalues[lVar3].isLocal = isLocal;
  compiler->upvalues[lVar3].index = index;
  pOVar2->upvalueCount = uVar1 + 1;
  return uVar1;
}

Assistant:

static int addUpvalue(Compiler* compiler, uint8_t index, bool isLocal) {
    /**
     * before we add a new upvalue,
     * we first check to see if the function already has an upvalue that closes over that variable:
     */
    int upvalueCount = compiler->function->upvalueCount;
    for (int i = 0; i < upvalueCount; i++) {
        Upvalue* upvalue = &compiler->upvalues[i];
        if (upvalue->index == index && upvalue->isLocal == isLocal) {
            return i;
        }
    }

    //ensure the compiler doesn’t overflow that limit:
    if (upvalueCount == UINT8_COUNT) {
        error("Too many closure variables in function.");
        return 0;
    }

    // if be functions hasn't the upvalue create new one
    compiler->upvalues[upvalueCount].isLocal = isLocal;
    compiler->upvalues[upvalueCount].index = index;
    return compiler->function->upvalueCount++;
}